

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_CND(Context *ctx)

{
  int iVar1;
  SourceArgInfo *src;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar1 == 0) {
    iVar1 = shader_version_atleast(ctx,'\x01','\x04');
    if ((iVar1 == 0) &&
       (((ctx->source_args[0].regtype != REG_TYPE_TEMP || (ctx->source_args[0].regnum != 0)) ||
        (ctx->source_args[0].swizzle != 0xff)))) {
      fail(ctx,"CND src must be r0.a in this shader model");
    }
  }
  else {
    fail(ctx,"CND not allowed in this shader model");
  }
  return;
}

Assistant:

static void state_CND(Context *ctx)
{
    // apparently it was removed...it's not in the docs past ps_1_4 ...
    if (shader_version_atleast(ctx, 2, 0))
        fail(ctx, "CND not allowed in this shader model");

    // extra limitations for ps <= 1.4 ...
    else if (!shader_version_atleast(ctx, 1, 4))
    {
        const SourceArgInfo *src = &ctx->source_args[0];
        if ((src->regtype != REG_TYPE_TEMP) || (src->regnum != 0) ||
            (src->swizzle != 0xFF))
        {
            fail(ctx, "CND src must be r0.a in this shader model");
        } // if
    } // if
}